

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O3

void __thiscall doctest::anon_unknown_14::ConsoleReporter::logTestStart(ConsoleReporter *this)

{
  ostream *poVar1;
  int iVar2;
  size_t sVar3;
  TestCaseData *pTVar4;
  pointer pSVar5;
  char *pcVar6;
  pointer pSVar7;
  ulong uVar8;
  TestCaseData *pTVar9;
  long lVar10;
  ulong uVar11;
  
  if (this->hasLoggedCurrentTestStart == false) {
    poVar1 = this->s;
    Color::operator<<(poVar1,Yellow);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar1,
               "===============================================================================\n",
               0x50);
    pTVar4 = this->tc;
    pTVar9 = pTVar4;
    if ((pTVar4->m_file).field_0.buf[0x17] < '\0') {
      pTVar9 = (TestCaseData *)(pTVar4->m_file).field_0.data.ptr;
    }
    (*(this->super_IReporter)._vptr_IReporter[0xe])(this,pTVar9,(ulong)pTVar4->m_line,"\n");
    pTVar4 = this->tc;
    if (pTVar4->m_description != (char *)0x0) {
      poVar1 = this->s;
      Color::operator<<(poVar1,Yellow);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,"DESCRIPTION: ",0xd);
      Color::operator<<(poVar1,None);
      pcVar6 = this->tc->m_description;
      if (pcVar6 == (char *)0x0) {
        std::ios::clear((int)poVar1 + (int)*(undefined8 *)(*(long *)poVar1 + -0x18));
      }
      else {
        sVar3 = strlen(pcVar6);
        std::__ostream_insert<char,std::char_traits<char>>(poVar1,pcVar6,sVar3);
      }
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
      pTVar4 = this->tc;
    }
    if ((pTVar4->m_test_suite != (char *)0x0) && (*pTVar4->m_test_suite != '\0')) {
      poVar1 = this->s;
      Color::operator<<(poVar1,Yellow);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,"TEST SUITE: ",0xc);
      Color::operator<<(poVar1,None);
      pcVar6 = this->tc->m_test_suite;
      if (pcVar6 == (char *)0x0) {
        std::ios::clear((int)poVar1 + (int)*(undefined8 *)(*(long *)poVar1 + -0x18));
      }
      else {
        sVar3 = strlen(pcVar6);
        std::__ostream_insert<char,std::char_traits<char>>(poVar1,pcVar6,sVar3);
      }
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
      pTVar4 = this->tc;
    }
    iVar2 = strncmp(pTVar4->m_name,"  Scenario:",0xb);
    if (iVar2 != 0) {
      poVar1 = this->s;
      Color::operator<<(poVar1,Yellow);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,"TEST CASE:  ",0xc);
    }
    poVar1 = this->s;
    Color::operator<<(poVar1,None);
    pcVar6 = this->tc->m_name;
    if (pcVar6 == (char *)0x0) {
      std::ios::clear((int)poVar1 + (int)*(undefined8 *)(*(long *)poVar1 + -0x18));
    }
    else {
      sVar3 = strlen(pcVar6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,pcVar6,sVar3);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
    uVar11 = this->currentSubcaseLevel;
    if (uVar11 == 0) {
      uVar11 = 0;
    }
    else {
      lVar10 = 0;
      uVar8 = 0;
      do {
        pSVar5 = (this->subcasesStack).
                 super__Vector_base<doctest::SubcaseSignature,_std::allocator<doctest::SubcaseSignature>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        if ((pSVar5->m_name).field_0.buf[lVar10 + 0x17] < '\0') {
          pcVar6 = *(char **)((long)&(pSVar5->m_name).field_0 + lVar10);
        }
        else {
          pcVar6 = (pSVar5->m_name).field_0.buf + lVar10;
        }
        if (*pcVar6 != '\0') {
          poVar1 = this->s;
          std::__ostream_insert<char,std::char_traits<char>>(poVar1,"  ",2);
          doctest::operator<<(poVar1,(String *)
                                     ((long)&(((this->subcasesStack).
                                               super__Vector_base<doctest::SubcaseSignature,_std::allocator<doctest::SubcaseSignature>_>
                                               ._M_impl.super__Vector_impl_data._M_start)->m_name).
                                             field_0 + lVar10));
          std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
          uVar11 = this->currentSubcaseLevel;
        }
        uVar8 = uVar8 + 1;
        lVar10 = lVar10 + 0x28;
      } while (uVar8 < uVar11);
    }
    if (uVar11 != ((long)(this->subcasesStack).
                         super__Vector_base<doctest::SubcaseSignature,_std::allocator<doctest::SubcaseSignature>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)(this->subcasesStack).
                         super__Vector_base<doctest::SubcaseSignature,_std::allocator<doctest::SubcaseSignature>_>
                         ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x3333333333333333) {
      poVar1 = this->s;
      Color::operator<<(poVar1,Yellow);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar1,"\nDEEPEST SUBCASE STACK REACHED (DIFFERENT FROM THE CURRENT ONE):\n",0x41);
      Color::operator<<(poVar1,None);
      pSVar5 = (this->subcasesStack).
               super__Vector_base<doctest::SubcaseSignature,_std::allocator<doctest::SubcaseSignature>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pSVar7 = (this->subcasesStack).
               super__Vector_base<doctest::SubcaseSignature,_std::allocator<doctest::SubcaseSignature>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if (pSVar7 != pSVar5) {
        lVar10 = 0;
        uVar11 = 0;
        do {
          if ((pSVar5->m_name).field_0.buf[lVar10 + 0x17] < '\0') {
            pcVar6 = *(char **)((long)&(pSVar5->m_name).field_0 + lVar10);
          }
          else {
            pcVar6 = (pSVar5->m_name).field_0.buf + lVar10;
          }
          if (*pcVar6 != '\0') {
            poVar1 = this->s;
            std::__ostream_insert<char,std::char_traits<char>>(poVar1,"  ",2);
            doctest::operator<<(poVar1,(String *)
                                       ((long)&(((this->subcasesStack).
                                                 super__Vector_base<doctest::SubcaseSignature,_std::allocator<doctest::SubcaseSignature>_>
                                                 ._M_impl.super__Vector_impl_data._M_start)->m_name)
                                               .field_0 + lVar10));
            std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
            pSVar5 = (this->subcasesStack).
                     super__Vector_base<doctest::SubcaseSignature,_std::allocator<doctest::SubcaseSignature>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            pSVar7 = (this->subcasesStack).
                     super__Vector_base<doctest::SubcaseSignature,_std::allocator<doctest::SubcaseSignature>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
          }
          uVar11 = uVar11 + 1;
          lVar10 = lVar10 + 0x28;
        } while (uVar11 < (ulong)(((long)pSVar7 - (long)pSVar5 >> 3) * -0x3333333333333333));
      }
    }
    std::__ostream_insert<char,std::char_traits<char>>(this->s,"\n",1);
    this->hasLoggedCurrentTestStart = true;
  }
  return;
}

Assistant:

void logTestStart() {
            if(hasLoggedCurrentTestStart)
                return;

            separator_to_stream();
            file_line_to_stream(tc->m_file.c_str(), tc->m_line, "\n");
            if(tc->m_description)
                s << Color::Yellow << "DESCRIPTION: " << Color::None << tc->m_description << "\n";
            if(tc->m_test_suite && tc->m_test_suite[0] != '\0')
                s << Color::Yellow << "TEST SUITE: " << Color::None << tc->m_test_suite << "\n";
            if(strncmp(tc->m_name, "  Scenario:", 11) != 0)
                s << Color::Yellow << "TEST CASE:  ";
            s << Color::None << tc->m_name << "\n";

            for(size_t i = 0; i < currentSubcaseLevel; ++i) {
                if(subcasesStack[i].m_name[0] != '\0')
                    s << "  " << subcasesStack[i].m_name << "\n";
            }

            if(currentSubcaseLevel != subcasesStack.size()) {
                s << Color::Yellow << "\nDEEPEST SUBCASE STACK REACHED (DIFFERENT FROM THE CURRENT ONE):\n" << Color::None;
                for(size_t i = 0; i < subcasesStack.size(); ++i) {
                    if(subcasesStack[i].m_name[0] != '\0')
                        s << "  " << subcasesStack[i].m_name << "\n";
                }
            }

            s << "\n";

            hasLoggedCurrentTestStart = true;
        }